

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextVkImpl::InsertDebugLabel(DeviceContextVkImpl *this,Char *Label,float *pColor)

{
  VkDebugUtilsLabelEXT Info;
  VkDebugUtilsLabelEXT local_48;
  
  DeviceContextBase<Diligent::EngineVkImplTraits>::InsertDebugLabel
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,Label,pColor,0);
  local_48.pNext = (void *)0x0;
  local_48.color[0] = 0.0;
  local_48.color[1] = 0.0;
  local_48.color[2] = 0.0;
  local_48.color[3] = 0.0;
  local_48.sType = VK_STRUCTURE_TYPE_DEBUG_UTILS_LABEL_EXT;
  local_48._4_4_ = 0;
  if (pColor != (float *)0x0) {
    local_48.color._0_8_ = *(undefined8 *)pColor;
    local_48.color._8_8_ = *(undefined8 *)(pColor + 2);
  }
  local_48.pLabelName = Label;
  EnsureVkCmdBuffer(this);
  VulkanUtilities::VulkanCommandBuffer::InsertDebugUtilsLabel(&this->m_CommandBuffer,&local_48);
  return;
}

Assistant:

void DeviceContextVkImpl::InsertDebugLabel(const Char* Label, const float* pColor)
{
    TDeviceContextBase::InsertDebugLabel(Label, pColor, 0);

    VkDebugUtilsLabelEXT Info{};
    Info.sType      = VK_STRUCTURE_TYPE_DEBUG_UTILS_LABEL_EXT;
    Info.pLabelName = Label;

    if (pColor != nullptr)
        memcpy(Info.color, pColor, sizeof(Info.color));

    EnsureVkCmdBuffer();
    m_CommandBuffer.InsertDebugUtilsLabel(Info);
}